

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void lua_rawseti(lua_State *L,int idx,int n)

{
  GCObject *pGVar1;
  global_State *pgVar2;
  global_State *g;
  TValue *pTVar3;
  TValue *pTVar4;
  StkId pTVar5;
  GCObject *o;
  
  pTVar3 = index2adr(L,idx);
  pTVar5 = L->top;
  pTVar4 = luaH_setnum(L,&((pTVar3->value).gc)->h,n);
  pTVar4->value = pTVar5[-1].value;
  pTVar4->tt = pTVar5[-1].tt;
  pTVar5 = L->top;
  if ((3 < pTVar5[-1].tt) && ((((pTVar5[-1].value.gc)->gch).marked & 3) != 0)) {
    pGVar1 = (pTVar3->value).gc;
    if (((pGVar1->gch).marked & 4) != 0) {
      pgVar2 = L->l_G;
      (pGVar1->gch).marked = (pGVar1->gch).marked & 0xfb;
      (pGVar1->h).gclist = pgVar2->grayagain;
      pgVar2->grayagain = pGVar1;
      pTVar5 = L->top;
    }
  }
  L->top = pTVar5 + -1;
  return;
}

Assistant:

static void lua_rawseti(lua_State*L,int idx,int n){
StkId o;
api_checknelems(L,1);
o=index2adr(L,idx);
luai_apicheck(L,ttistable(o));
setobj(L,luaH_setnum(L,hvalue(o),n),L->top-1);
luaC_barriert(L,hvalue(o),L->top-1);
L->top--;
}